

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.h
# Opt level: O2

float __thiscall
mp::opt<float,mp::opt_null_type_policy<float,(anonymous_namespace)::null_floating<float>>>::
value_or<float_const&>
          (opt<float,mp::opt_null_type_policy<float,(anonymous_namespace)::null_floating<float>>>
           *this,float *default_value)

{
  if ((*(float *)this != 0.0) || (NAN(*(float *)this))) {
    opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>::
    operator*((opt<float,_mp::opt_null_type_policy<float,_(anonymous_namespace)::null_floating<float>_>_>
               *)this);
    default_value = (float *)this;
  }
  return *default_value;
}

Assistant:

static constexpr bool has_value(const U& storage) noexcept(noexcept(Policy::has_value(storage)))
    {
      return Policy::has_value(storage);
    }